

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O2

IMP class_replaceMethod(Class cls,SEL name,IMP imp,char *types)

{
  char *selName;
  SEL aSelector;
  Method poVar1;
  IMP p_Var2;
  
  if (cls != (Class)0x0) {
    selName = sel_getName(name);
    aSelector = sel_registerTypedName_np(selName,types);
    poVar1 = class_getInstanceMethodNonrecursive(cls,aSelector);
    if (poVar1 == (Method)0x0) {
      class_addMethod(cls,aSelector,imp,types);
      p_Var2 = (IMP)0x0;
    }
    else {
      p_Var2 = poVar1->imp;
      poVar1->imp = imp;
    }
    return p_Var2;
  }
  return (IMP)0x0;
}

Assistant:

IMP class_replaceMethod(Class cls, SEL name, IMP imp, const char *types)
{
	if (Nil == cls) { return (IMP)0; }
	SEL sel = sel_registerTypedName_np(sel_getName(name), types);
	Method method = class_getInstanceMethodNonrecursive(cls, sel);
	if (method == NULL)
	{
		class_addMethod(cls, sel, imp, types);
		return NULL;
	}
	IMP old = (IMP)method->imp;
	method->imp = imp;
	return old;
}